

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifier.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::CoreMLModels::TextClassifier::MergePartialFromCodedStream
          (TextClassifier *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  short extraout_AX;
  short extraout_AX_00;
  short sVar5;
  short extraout_AX_01;
  uint uVar6;
  int iVar7;
  uint32 uVar8;
  StringVector *this_00;
  ulong extraout_RAX;
  uint uVar9;
  ulong uVar10;
  int local_50;
  int local_4c;
  
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar9 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar8 = (uint)bVar2, (~(uint)*pbVar1 & uVar9) < 0x80)
           ) goto LAB_004ddf1d;
        uVar9 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar10 = (ulong)uVar9 | 0x100000000;
    }
    else {
LAB_004ddf1d:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar10 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar8 | uVar10;
    }
    uVar9 = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) {
LAB_004dde7d:
      iVar7 = 7;
      if ((uVar9 & 7) != 4 && uVar9 != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar9);
        if (bVar4) {
LAB_004ddeab:
          iVar7 = 0;
        }
        else {
          iVar7 = 6;
        }
      }
    }
    else {
      uVar6 = (uint)(uVar10 >> 3) & 0x1fffffff;
      if (uVar6 < 200) {
        if (uVar6 == 1) {
          MergePartialFromCodedStream();
          sVar5 = extraout_AX_00;
LAB_004ddedd:
          if (sVar5 != 0) {
            iVar7 = 6;
joined_r0x004ddf15:
            if (sVar5 == 1) goto LAB_004ddeab;
            goto LAB_004ddead;
          }
        }
        else if (uVar6 == 10) {
          MergePartialFromCodedStream();
          iVar7 = local_4c;
          sVar5 = extraout_AX_01;
          if (extraout_AX_01 != 0) goto joined_r0x004ddf15;
        }
        else if (uVar6 == 100) {
          MergePartialFromCodedStream();
          sVar5 = extraout_AX;
          goto LAB_004ddedd;
        }
        goto LAB_004dde7d;
      }
      if ((uVar6 != 200) || ((char)uVar10 != 'B')) goto LAB_004dde7d;
      if (this->_oneof_case_[0] != 200) {
        this->_oneof_case_[0] = 200;
        this_00 = (StringVector *)operator_new(0x30);
        StringVector::StringVector(this_00);
        (this->ClassLabels_).stringclasslabels_ = this_00;
      }
      MergePartialFromCodedStream();
      iVar7 = local_50;
      if ((extraout_RAX & 1) == 0) goto LAB_004ddeab;
    }
LAB_004ddead:
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool TextClassifier::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CoreMLModels.TextClassifier)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint32 revision = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &revision_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string language = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_language()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->language().data(), this->language().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.TextClassifier.language"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes modelParameterData = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_modelparameterdata()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CoreMLModels.TextClassifier)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CoreMLModels.TextClassifier)
  return false;
#undef DO_
}